

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

tensor * __thiscall
dlib::
add_layer<dlib::add_prev_<dlib::tag1>,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>
::forward(add_layer<dlib::add_prev_<dlib::tag1>,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>
          *this,tensor *x)

{
  subnet_wrapper<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
  wsub;
  subnet_wrapper<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
  local_68;
  
  add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>
  ::forward((this->subnetwork)._M_t.
            super___uniq_ptr_impl<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_*,_std::default_delete<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>_>
            .
            super__Head_base<0UL,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_*,_false>
            ._M_head_impl,x);
  local_68.l = (this->subnetwork)._M_t.
               super___uniq_ptr_impl<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_*,_std::default_delete<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>_>
               .
               super__Head_base<0UL,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_*,_false>
               ._M_head_impl;
  local_68.subnetwork.l =
       *(add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>
         **)&((local_68.l)->subnetwork)._M_t.
             super___uniq_ptr_impl<dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>_>
  ;
  local_68.subnetwork.subnetwork.l =
       *(add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>
         **)((long)local_68.subnetwork.l + 0x180);
  local_68.subnetwork.subnetwork.subnetwork.l =
       *(add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>
         **)&((local_68.subnetwork.subnetwork.l)->subnetwork)._M_t.
             super___uniq_ptr_impl<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_>_>
  ;
  local_68.subnetwork.subnetwork.subnetwork.subnetwork.l =
       *(add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>
         **)((long)local_68.subnetwork.subnetwork.subnetwork.l + 0x1c8);
  local_68.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.l =
       *(add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>
         **)&((local_68.subnetwork.subnetwork.subnetwork.subnetwork.l)->subnetwork)._M_t.
             super___uniq_ptr_impl<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>_>_>
  ;
  local_68.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.l =
       *(add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>
         **)((long)local_68.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.l + 0xa0);
  local_68.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.l =
       *(add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>
         **)&((local_68.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.l)->
             subnetwork)._M_t.
             super___uniq_ptr_impl<dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>_>_>
  ;
  local_68.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.l
       = *(add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void> **)
          ((long)local_68.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.
                 subnetwork.l + 0x180);
  local_68.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.
  subnetwork._sample_expansion_factor =
       (local_68.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.
        subnetwork.l)->_sample_expansion_factor;
  if (this->this_layer_setup_called == false) {
    this->this_layer_setup_called = true;
  }
  local_68.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.
  subnetwork.l = (repeat_input_layer *)
                 local_68.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.
                 subnetwork.subnetwork.l;
  add_prev_<dlib::tag1>::
  forward<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<256l,1l,1l,1,1,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<64l,3l,3l,1,1,1,1>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<64l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,void>,void>,void>,void>,void>,void>,void>,true,void>>
            (&this->details,&local_68,&this->cached_output);
  this->gradient_input_is_stale = true;
  return &(this->cached_output).super_tensor;
}

Assistant:

const tensor& forward(const tensor& x)
        {
            subnetwork->forward(x);
            const dimpl::subnet_wrapper<subnet_type> wsub(*subnetwork);
            if (!this_layer_setup_called)
            {
                details.setup(wsub);
                this_layer_setup_called = true;
            }
            if (this_layer_operates_inplace())
                impl::call_layer_forward(details, wsub, private_get_output());
            else
                impl::call_layer_forward(details, wsub, cached_output);

            gradient_input_is_stale = true;
            return private_get_output();
        }